

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_FindReplace(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int nPats,
                    Vec_Int_t *vSupp)

{
  int iVar1;
  int *piVar2;
  word *pwVar3;
  lit *begin;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  word Mask [256];
  word Covered [256];
  word Both [256];
  ulong local_1838 [256];
  ulong local_1038 [256];
  ulong auStack_838 [257];
  
  uVar12 = ((nPats >> 6) + 1) - (uint)((nPats & 0x3fU) == 0);
  if (0x100 < (int)uVar12) {
    __assert_fail("nWords <= NWORDS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x429,
                  "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  uVar13 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    memset(local_1838,0,uVar13 * 8);
  }
  if (0 < nPats) {
    uVar9 = 0;
    do {
      local_1838[uVar9 >> 6] = local_1838[uVar9 >> 6] | 1L << ((byte)uVar9 & 0x3f);
      uVar4 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar4;
    } while (nPats != uVar4);
  }
  uVar9 = (ulong)(uint)vSupp->nSize;
  if (0 < vSupp->nSize) {
    lVar11 = 0;
    do {
      piVar2 = vSupp->pArray;
      uVar4 = piVar2[lVar11];
      if ((int)uVar4 < 0) {
LAB_00394c56:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (0 < (int)uVar12) {
        memset(local_1038,0,uVar13 * 8);
      }
      if (0 < (int)uVar9) {
        uVar5 = 0;
        do {
          uVar7 = piVar2[uVar5];
          if (uVar7 != uVar4) {
            if ((int)uVar7 < 0) goto LAB_00394c56;
            iVar6 = (uVar7 >> 1) - iFirstDiv;
            if ((iVar6 < 0) || (uVar7 = iVar6 * 0x100, vPats->nSize <= (int)uVar7))
            goto LAB_00394c18;
            if (0 < (int)uVar12) {
              pwVar3 = vPats->pArray;
              uVar10 = 0;
              do {
                local_1038[uVar10] = local_1038[uVar10] | pwVar3[uVar7 + uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar13 != uVar10);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uVar9 & 0xffffffff));
      }
      uVar7 = (uVar4 >> 1) - iFirstDiv;
      if (0 < (int)uVar7) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          if (((long)vWeights->nSize <= (long)uVar9) || (vWeights->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = vWeights->pArray[uVar7];
          iVar1 = vWeights->pArray[uVar9];
          if (iVar1 != iVar6) {
            if (iVar6 <= iVar1) {
              __assert_fail("Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                            ,0x440,
                            "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                           );
            }
            if ((long)vPats->nSize <= (long)(uVar9 * 0x100)) {
LAB_00394c18:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            if (0 < (int)uVar12) {
              pwVar3 = vPats->pArray;
              uVar5 = 0;
              do {
                auStack_838[uVar5] =
                     *(ulong *)((long)pwVar3 + uVar5 * 8 + lVar8) | local_1038[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar13 != uVar5);
              if (0 < (int)uVar12) {
                uVar5 = 0;
                do {
                  if (auStack_838[uVar5] != local_1838[uVar5]) goto LAB_00394bc0;
                  uVar5 = uVar5 + 1;
                } while (uVar13 != uVar5);
              }
            }
            if ((long)(uVar9 + (long)iFirstDiv) < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            if (vSupp->nSize <= lVar11) {
LAB_00394c37:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            begin = vSupp->pArray;
            begin[lVar11] = (int)(uVar9 + (long)iFirstDiv) * 2 + 1;
            iVar6 = sat_solver_solve(pSat,begin,begin + vSupp->nSize,0,0,0,0);
            if (iVar6 == -1) break;
            if (vSupp->nSize <= lVar11) goto LAB_00394c37;
            vSupp->pArray[lVar11] = uVar4;
          }
LAB_00394bc0:
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x800;
        } while (uVar9 != uVar7);
      }
      lVar11 = lVar11 + 1;
      uVar9 = (ulong)vSupp->nSize;
    } while (lVar11 < (long)uVar9);
  }
  return;
}

Assistant:

void Acb_FindReplace( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int nPats, Vec_Int_t * vSupp )
{
    int i, k, iLit, iLit2, status, nWords = Abc_Bit6WordNum(nPats);
    word Covered[NWORDS], Both[NWORDS], Mask[NWORDS], * pMask; 
    assert( nWords <= NWORDS );
    // prepare constant pattern
    Abc_TtConst( Mask, nWords, 0 );
    for ( i = 0; i < nPats; i++ )
        Abc_TtSetBit( Mask, i );
    // try to replace each by a cheaper one
    Vec_IntForEachEntry( vSupp, iLit, i )
    {
        int iDiv = Abc_Lit2Var(iLit) - iFirstDiv;
        // collect covered except by this one
        Abc_TtConst( Covered, nWords, 0 );
        Vec_IntForEachEntry( vSupp, iLit2, k )
        {
            if ( iLit2 == iLit )
                continue;
            pMask = Vec_WrdEntryP( vPats, NWORDS*(Abc_Lit2Var(iLit2) - iFirstDiv) );
            Abc_TtOr( Covered, Covered, pMask, nWords );
        }
        // consider any cheaper ones that this one
        for ( k = 0; k < iDiv; k++ )
        {
            if ( Vec_IntEntry(vWeights, k) == Vec_IntEntry(vWeights, iDiv) )
                continue;
            assert( Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv) );
            pMask = Vec_WrdEntryP( vPats, NWORDS*k );
            // check if it covers the remaining ones
            Abc_TtOr( Both, Covered, pMask, nWords );
            if ( !Abc_TtEqual(Both, Mask, nWords) )
                continue;
            // try this one
            Vec_IntWriteEntry( vSupp, i, Abc_Var2Lit(iFirstDiv+k, 1) );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status == l_False ) // success
            {
                //printf( "Replacing %d(%d) by %d(%d) with const difference %d.\n",
                //    iDiv, Vec_IntEntry(vWeights, iDiv), k, Vec_IntEntry(vWeights, k), 
                //    Vec_IntEntry(vWeights, iDiv) - Vec_IntEntry(vWeights, k) );
                break;
            }
            Vec_IntWriteEntry( vSupp, i, iLit );
        }
    }
}